

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O0

int __thiscall xe::xml::EscapeStreambuf::overflow(EscapeStreambuf *this,int ch)

{
  long lVar1;
  int local_2c;
  undefined1 local_1d;
  int local_1c;
  char chVal;
  EscapeStreambuf *pEStack_18;
  int ch_local;
  EscapeStreambuf *this_local;
  
  if (ch == -1) {
    this_local._4_4_ = -1;
  }
  else {
    local_1d = (undefined1)ch;
    local_1c = ch;
    pEStack_18 = this;
    lVar1 = (**(code **)(*(long *)this + 0x60))(this,&local_1d,1);
    if (lVar1 == 1) {
      local_2c = local_1c;
    }
    else {
      local_2c = -1;
    }
    this_local._4_4_ = local_2c;
  }
  return this_local._4_4_;
}

Assistant:

int EscapeStreambuf::overflow (int ch)
{
	if (ch == -1)
		return -1;
	else
	{
		DE_ASSERT((ch & 0xff) == ch);
		const char chVal = (char)(deUint8)(ch & 0xff);
		return xsputn(&chVal, 1) == 1 ? ch : -1;
	}
}